

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlParseEntityValue(xmlParserCtxtPtr ctxt,xmlChar **orig)

{
  xmlChar xVar1;
  xmlChar xVar2;
  int iVar3;
  xmlParserInputPtr pxVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  xmlParserErrors code;
  long lVar7;
  xmlSBuf buf;
  char *pcVar8;
  xmlSBuf local_48;
  
  local_48.max = 1000000000;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    local_48.max = 10000000;
  }
  local_48.mem = (xmlChar *)0x0;
  local_48.size = 0;
  local_48.cap = 0;
  local_48.code = XML_ERR_OK;
  pxVar4 = ctxt->input;
  if (((pxVar4->flags & 0x40) == 0) && ((long)pxVar4->end - (long)pxVar4->cur < 0xfa)) {
    xmlParserGrow(ctxt);
    pxVar4 = ctxt->input;
  }
  xVar1 = *pxVar4->cur;
  if ((xVar1 == '\"') || (xVar1 == '\'')) {
    pxVar4->cur = pxVar4->cur + 1;
    iVar3 = ctxt->disableSAX;
    if (iVar3 < 2) {
      lVar7 = 0;
      do {
        pxVar4 = ctxt->input;
        pxVar6 = pxVar4->cur;
        if (pxVar4->end <= pxVar6) {
          pcVar8 = (char *)0x0;
          code = XML_ERR_ENTITY_NOT_FINISHED;
LAB_00134a13:
          xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,code,XML_ERR_FATAL,(xmlChar *)0x0,
                     (xmlChar *)0x0,(xmlChar *)0x0,0,"%s",pcVar8);
          break;
        }
        xVar2 = *pxVar6;
        if (xVar2 == '\0') {
          pcVar8 = "invalid character in entity value\n";
          code = XML_ERR_INVALID_CHAR;
          goto LAB_00134a13;
        }
        if (xVar2 == xVar1) {
          if (orig != (xmlChar **)0x0) {
            pxVar5 = xmlStrndup(pxVar6 + -lVar7,(int)lVar7);
            *orig = pxVar5;
            if (pxVar5 == (xmlChar *)0x0) {
              xmlCtxtErrMemory(ctxt);
            }
          }
          xmlExpandPEsInEntityValue(ctxt,&local_48,pxVar6 + -lVar7,(int)lVar7,ctxt->inputNr);
          pxVar4 = ctxt->input;
          if (*pxVar4->cur == '\n') {
            pxVar4->line = pxVar4->line + 1;
            pxVar4->col = 1;
          }
          else {
            pxVar4->col = pxVar4->col + 1;
          }
          pxVar4->cur = pxVar4->cur + 1;
          pxVar6 = xmlSBufFinish(&local_48,(int *)0x0,ctxt,"entity length too long");
          return pxVar6;
        }
        if (xVar2 == '\n') {
          pxVar4->line = pxVar4->line + 1;
          pxVar4->col = 1;
        }
        else {
          pxVar4->col = pxVar4->col + 1;
        }
        pxVar4->cur = pxVar6 + 1;
        if (((long)pxVar4->end - (long)(pxVar6 + 1) < 10) && ((pxVar4->flags & 0x40) == 0)) {
          xmlParserGrow(ctxt);
          iVar3 = ctxt->disableSAX;
        }
        lVar7 = lVar7 + 1;
      } while (iVar3 < 2);
    }
    xmlSBufCleanup(&local_48,ctxt,"entity length too long");
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_ATTRIBUTE_NOT_STARTED,(char *)0x0);
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlParseEntityValue(xmlParserCtxtPtr ctxt, xmlChar **orig) {
    unsigned maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                         XML_MAX_HUGE_LENGTH :
                         XML_MAX_TEXT_LENGTH;
    xmlSBuf buf;
    const xmlChar *start;
    int quote, length;

    xmlSBufInit(&buf, maxLength);

    GROW;

    quote = CUR;
    if ((quote != '"') && (quote != '\'')) {
	xmlFatalErr(ctxt, XML_ERR_ATTRIBUTE_NOT_STARTED, NULL);
	return(NULL);
    }
    CUR_PTR++;

    length = 0;

    /*
     * Copy raw content of the entity into a buffer
     */
    while (1) {
        int c;

        if (PARSER_STOPPED(ctxt))
            goto error;

        if (CUR_PTR >= ctxt->input->end) {
            xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_NOT_FINISHED, NULL);
            goto error;
        }

        c = CUR;

        if (c == 0) {
            xmlFatalErrMsg(ctxt, XML_ERR_INVALID_CHAR,
                    "invalid character in entity value\n");
            goto error;
        }
        if (c == quote)
            break;
        NEXTL(1);
        length += 1;

        /*
         * TODO: Check growth threshold
         */
        if (ctxt->input->end - CUR_PTR < 10)
            GROW;
    }

    start = CUR_PTR - length;

    if (orig != NULL) {
        *orig = xmlStrndup(start, length);
        if (*orig == NULL)
            xmlErrMemory(ctxt);
    }

    xmlExpandPEsInEntityValue(ctxt, &buf, start, length, ctxt->inputNr);

    NEXTL(1);

    return(xmlSBufFinish(&buf, NULL, ctxt, "entity length too long"));

error:
    xmlSBufCleanup(&buf, ctxt, "entity length too long");
    return(NULL);
}